

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

void free_node(_node_t *n)

{
  void *in_RDI;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  
  for (uVar1 = 0; uVar1 < *(uint *)((long)in_RDI + 8); uVar1 = uVar1 + 1) {
    if (*(long *)(*(long *)((long)in_RDI + 0x18) + (ulong)uVar1 * 8) != 0) {
      free_node((_node_t *)CONCAT44(uVar1,in_stack_fffffffffffffff0));
    }
  }
  if (*(long *)((long)in_RDI + 0x18) != 0) {
    free(*(void **)((long)in_RDI + 0x18));
  }
  free(in_RDI);
  return;
}

Assistant:

void free_node(_node_t* n)
{
    unsigned int i;
    for (i = 0; i < n->num_children; i++)
    {
        if (n->children[i])
            free_node(n->children[i]);
    }

    if (n->children)
        free(n->children);

    free(n);
}